

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildBrInt1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,int32 relativeOffset,RegSlot src
          )

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  RegSlot srcRegSlot;
  uint uVar3;
  undefined4 *puVar4;
  RegOpnd *this_00;
  BranchInstr *branchInstr_00;
  BranchInstr *branchInstr;
  uint targetOffset;
  RegOpnd *src1Opnd;
  RegSlot src1RegSlot;
  OpCode op;
  RegSlot src_local;
  int32 relativeOffset_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  src1Opnd._6_2_ = Nop;
  if (newOpcode == BrTrue_Int) {
    src1Opnd._6_2_ = BrTrue_I4;
  }
  else if (newOpcode == BrFalse_Int) {
    src1Opnd._6_2_ = BrFalse_I4;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xbae,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  srcRegSlot = GetRegSlotFromIntReg(this,src);
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyInt32);
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  uVar3 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  branchInstr_00 =
       IR::BranchInstr::New(src1Opnd._6_2_,(LabelInstr *)0x0,&this_00->super_Opnd,this->m_func);
  AddBranchInstr(this,branchInstr_00,offset,uVar3 + relativeOffset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildBrInt1(Js::OpCodeAsmJs newOpcode, uint32 offset, int32 relativeOffset, Js::RegSlot src)
{
    Js::OpCode op = Js::OpCode::Nop;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::BrTrue_Int:
        op = Js::OpCode::BrTrue_I4;
        break;
    case Js::OpCodeAsmJs::BrFalse_Int:
        op = Js::OpCode::BrFalse_I4;
        break;
    default:
        Assume(UNREACHED);
    }
    Js::RegSlot src1RegSlot = GetRegSlotFromIntReg(src);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TyInt32);
    src1Opnd->SetValueType(ValueType::GetInt(false));

    uint targetOffset = m_jnReader.GetCurrentOffset() + relativeOffset;

    IR::BranchInstr * branchInstr = IR::BranchInstr::New(op, nullptr, src1Opnd, m_func);
    AddBranchInstr(branchInstr, offset, targetOffset);
}